

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

uint32_t Blowfish_stream2word(uint8_t *data,uint16_t databytes,uint16_t *current)

{
  uint local_28;
  ushort local_24;
  byte local_21;
  uint32_t temp;
  uint16_t j;
  uint8_t i;
  uint16_t *current_local;
  uint16_t databytes_local;
  uint8_t *data_local;
  
  local_28 = 0;
  local_24 = *current;
  for (local_21 = 0; local_21 < 4; local_21 = local_21 + 1) {
    if (databytes <= local_24) {
      local_24 = 0;
    }
    local_28 = local_28 << 8 | (uint)data[local_24];
    local_24 = local_24 + 1;
  }
  *current = local_24;
  return local_28;
}

Assistant:

static uint32_t
Blowfish_stream2word(const uint8_t *data, uint16_t databytes,
                     uint16_t *current)
{
    uint8_t i;
    uint16_t j;
    uint32_t temp;

    temp = 0x00000000;
    j = *current;

    for(i = 0; i < 4; i++, j++) {
        if(j >= databytes)
            j = 0;
        temp = (temp << 8) | data[j];
    }

    *current = j;
    return temp;
}